

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_wallmarks.cxx
# Opt level: O0

void __thiscall read_wallmark::operator()(read_wallmark *this,wm_object *wm,xr_reader *r)

{
  bool bVar1;
  uint32_t uVar2;
  float fVar3;
  xr_reader *r_local;
  wm_object *wm_local;
  read_wallmark *this_local;
  
  bVar1 = xray_re::xr_reader::r_bool(r);
  wm->selected = bVar1;
  xray_re::xr_reader::r_fvector3(r,(fvector3 *)&wm->bbox);
  xray_re::xr_reader::r_fvector3(r,&(wm->bbox).field_0.field_0.max);
  xray_re::xr_reader::r_fvector3(r,&(wm->bsphere).p);
  fVar3 = xray_re::xr_reader::r_float(r);
  (wm->bsphere).r = fVar3;
  fVar3 = xray_re::xr_reader::r_float(r);
  wm->width = fVar3;
  fVar3 = xray_re::xr_reader::r_float(r);
  wm->height = fVar3;
  fVar3 = xray_re::xr_reader::r_float(r);
  wm->rotate = fVar3;
  uVar2 = xray_re::xr_reader::r_u32(r);
  xray_re::xr_reader::r_seq<std::vector<xray_re::wm_vertex,std::allocator<xray_re::wm_vertex>>>
            (r,(ulong)uVar2,&wm->vertices);
  return;
}

Assistant:

void operator()(wm_object& wm, xr_reader& r) const {
	wm.selected = r.r_bool();
	r.r_fvector3(wm.bbox.min);
	r.r_fvector3(wm.bbox.max);
	r.r_fvector3(wm.bsphere.p);
	wm.bsphere.r = r.r_float();
	wm.width = r.r_float();
	wm.height = r.r_float();
	wm.rotate = r.r_float();
	r.r_seq(r.r_u32(), wm.vertices);
}